

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall IVmBifTadsRNG::get_state(IVmBifTadsRNG *this,vm_val_t *val)

{
  void *pvVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  undefined4 extraout_var;
  char *buf;
  undefined8 *puVar4;
  undefined8 uVar5;
  long *plVar6;
  err_frame_t err_cur__;
  uint local_108 [2];
  undefined8 local_100;
  void *local_f8;
  __jmp_buf_tag local_f0;
  ulong len;
  
  iVar2 = (*this->_vptr_IVmBifTadsRNG[6])();
  len = CONCAT44(extraout_var,iVar2);
  if (len == 0) {
    iVar2 = (*this->_vptr_IVmBifTadsRNG[7])(this);
    val->typ = VM_INT;
    (val->val).intval = iVar2;
  }
  else {
    buf = (char *)operator_new__(len);
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    local_100 = *puVar4;
    uVar5 = _ZTW11G_err_frame();
    *(uint **)uVar5 = local_108;
    local_108[0] = _setjmp(&local_f0);
    if (local_108[0] == 0) {
      (*this->_vptr_IVmBifTadsRNG[9])(this,buf);
      vVar3 = CVmObjByteArray::create_from_bytes(0,buf,len);
      val->typ = VM_OBJ;
      (val->val).obj = vVar3;
    }
    if (-1 < (short)local_108[0]) {
      local_108[0] = local_108[0] | 0x8000;
      operator_delete__(buf);
    }
    uVar5 = local_100;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = uVar5;
    if ((local_108[0] & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pvVar1 = local_f8;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar6 + 0x10) = pvVar1;
      err_rethrow();
    }
    if ((local_108[0] & 2) != 0) {
      free(local_f8);
    }
  }
  return;
}

Assistant:

void get_state(VMG_ vm_val_t *val)
    {
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            val->set_int(get_state_int());
        }
        else
        {
            /* allocate a buffer */
            char *buf = new char[len];

            /* make sure we delete the allocated buffer */
            err_try
            {
                /* get the state into our buffer */
                get_state_buf(buf);

                /* create a ByteArray from the state vector */
                val->set_obj(CVmObjByteArray::create_from_bytes(
                    vmg_ FALSE, buf, len));
            }
            err_finally
            {
                /* done with the buffer */
                delete [] buf;
            }